

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragOpInteractionCase.cpp
# Opt level: O3

int __thiscall deqp::gls::FragOpInteractionCase::init(FragOpInteractionCase *this,EVP_PKEY_CTX *ctx)

{
  Shader *vertexShader;
  Shader *fragmentShader;
  pointer ppSVar1;
  int height;
  int iVar2;
  int iVar3;
  deUint32 dVar4;
  int extraout_EAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  RandomShaderProgram *this_00;
  ReferenceContext *this_01;
  GLContext *this_02;
  ulong uVar5;
  ShaderInput **unifiedUniforms;
  ProgramGenerator generator;
  Random rnd;
  ProgramGenerator local_61;
  uint local_60;
  uint local_5c;
  ProgramParameters *local_58;
  IVec4 local_50;
  deRandom local_40;
  
  local_58 = &this->m_params;
  deRandom_init(&local_40,(this->m_params).seed ^ 0x232faac);
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar2 = *(int *)CONCAT44(extraout_var,iVar2);
  if (0x3f < iVar2) {
    iVar2 = 0x40;
  }
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)(CONCAT44(extraout_var_00,iVar3) + 4);
  height = 0x40;
  if (iVar3 < 0x40) {
    height = iVar3;
  }
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)CONCAT44(extraout_var_01,iVar3);
  dVar4 = deRandom_getUint32(&local_40);
  local_5c = dVar4 % ((iVar3 - iVar2) + 1U);
  iVar3 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  iVar3 = *(int *)(CONCAT44(extraout_var_02,iVar3) + 4);
  dVar4 = deRandom_getUint32(&local_40);
  local_60 = dVar4 % ((iVar3 - height) + 1U);
  rsg::ProgramGenerator::ProgramGenerator(&local_61);
  vertexShader = &this->m_vertexShader;
  fragmentShader = &this->m_fragmentShader;
  rsg::ProgramGenerator::generate(&local_61,local_58,vertexShader,fragmentShader);
  rsg::computeUnifiedUniforms(vertexShader,fragmentShader,&this->m_unifiedUniforms);
  this_00 = (RandomShaderProgram *)operator_new(600);
  ppSVar1 = (this->m_unifiedUniforms).
            super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  uVar5 = (long)(this->m_unifiedUniforms).
                super__Vector_base<const_rsg::ShaderInput_*,_std::allocator<const_rsg::ShaderInput_*>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar1;
  unifiedUniforms = (ShaderInput **)0x0;
  if (uVar5 != 0) {
    unifiedUniforms = ppSVar1;
  }
  RandomShaderProgram::RandomShaderProgram
            (this_00,vertexShader,fragmentShader,(int)(uVar5 >> 3),unifiedUniforms);
  this->m_program = this_00;
  this_01 = (ReferenceContext *)operator_new(0x6280);
  ReferenceContext::ReferenceContext(this_01,this->m_renderCtx,iVar2,height);
  this->m_referenceCtx = this_01;
  this_02 = (GLContext *)operator_new(0x170);
  local_50.m_data[0] = local_5c;
  local_50.m_data[1] = local_60;
  local_50.m_data[2] = iVar2;
  local_50.m_data[3] = height;
  sglr::GLContext::GLContext
            (this_02,this->m_renderCtx,((this->super_TestCase).super_TestNode.m_testCtx)->m_log,3,
             &local_50);
  this->m_glCtx = this_02;
  dVar4 = sglr::ReferenceContext::createProgram
                    (&this->m_referenceCtx->context,&this->m_program->super_ShaderProgram);
  this->m_refProgram = dVar4;
  dVar4 = (*(this->m_glCtx->super_Context)._vptr_Context[0x75])();
  this->m_glProgram = dVar4;
  *(ulong *)(this->m_viewportSize).m_data = CONCAT44(height,iVar2);
  this->m_iterNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  rsg::ProgramGenerator::~ProgramGenerator(&local_61);
  return extraout_EAX;
}

Assistant:

void FragOpInteractionCase::init (void)
{
	de::Random				rnd				(m_params.seed ^ 0x232faac);
	const int				viewportW		= de::min<int>(m_renderCtx.getRenderTarget().getWidth(),	VIEWPORT_WIDTH);
	const int				viewportH		= de::min<int>(m_renderCtx.getRenderTarget().getHeight(),	VIEWPORT_HEIGHT);
	const int				viewportX		= rnd.getInt(0, m_renderCtx.getRenderTarget().getWidth()	- viewportW);
	const int				viewportY		= rnd.getInt(0, m_renderCtx.getRenderTarget().getHeight()	- viewportH);

	rsg::ProgramGenerator	generator;

	generator.generate(m_params, m_vertexShader, m_fragmentShader);
	rsg::computeUnifiedUniforms(m_vertexShader, m_fragmentShader, m_unifiedUniforms);

	try
	{
		DE_ASSERT(!m_program);
		m_program = new gls::RandomShaderProgram(m_vertexShader, m_fragmentShader, (int)m_unifiedUniforms.size(), m_unifiedUniforms.empty() ? DE_NULL : &m_unifiedUniforms[0]);

		DE_ASSERT(!m_referenceCtx);
		m_referenceCtx = new ReferenceContext(m_renderCtx, viewportW, viewportH);

		DE_ASSERT(!m_glCtx);
		m_glCtx = new sglr::GLContext(m_renderCtx, m_testCtx.getLog(), sglr::GLCONTEXT_LOG_CALLS|sglr::GLCONTEXT_LOG_PROGRAMS, IVec4(viewportX, viewportY, viewportW, viewportH));

		m_refProgram	= m_referenceCtx->context.createProgram(m_program);
		m_glProgram		= m_glCtx->createProgram(m_program);

		m_viewportSize	= tcu::IVec2(viewportW, viewportH);
		m_iterNdx		= 0;
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	catch (...)
	{
		// Save some memory by cleaning up stuff.
		FragOpInteractionCase::deinit();
		throw;
	}
}